

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O2

adt_str_t * dtl_json_dumps(dtl_dv_t *dv,int32_t indent,_Bool sortKeys)

{
  adt_str_t *paVar1;
  dtl_json_writer_t writer;
  
  writer.outputType = '\0';
  writer.indentWidth = 0;
  writer.currentIndent = 0;
  writer.indentArray = (adt_bytearray_t *)0x0;
  writer.destStr = (adt_str_t *)adt_str_new();
  writer.destFile = (FILE *)0x0;
  writer.sortKeys = false;
  writer.newLineStr = "\n";
  if (0 < indent) {
    dtl_json_writer_setIndentWidth(&writer,indent);
  }
  if (sortKeys) {
    writer.sortKeys = true;
  }
  dtl_json_writer_write_dv(&writer,dv,true);
  paVar1 = writer.destStr;
  dtl_json_writer_destroy(&writer,true);
  return paVar1;
}

Assistant:

adt_str_t* dtl_json_dumps(const dtl_dv_t *dv, int32_t indent, bool sortKeys)
{
   adt_str_t *retval = (adt_str_t*) 0;
   dtl_json_writer_t writer;
   dtl_json_writer_createWithString(&writer);
   if (indent > 0)
   {
      dtl_json_writer_setIndentWidth(&writer, indent);
   }
   if (sortKeys)
   {
      dtl_json_writer_setSortKeys(&writer, true);
   }
   dtl_json_writer_write_dv(&writer, dv, true);
   retval = writer.destStr;
   dtl_json_writer_destroy(&writer, true);
   return retval;
}